

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

void wallet::SetOptionsInputWeights(UniValue *inputs,UniValue *options)

{
  long lVar1;
  pointer pUVar2;
  string str;
  string key;
  UniValue val;
  UniValue val_00;
  bool bVar3;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar4;
  UniValue *__return_storage_ptr__;
  pointer this;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffe48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffe58;
  undefined1 auVar5 [32];
  undefined1 in_stack_fffffffffffffe68 [56];
  undefined1 in_stack_fffffffffffffea0 [32];
  UniValue local_128;
  string local_d0;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  UniValue weights;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&weights,"input_weights",(allocator<char> *)&local_d0);
  bVar3 = UniValue::exists(options,(string *)&weights);
  std::__cxx11::string::~string((string *)&weights);
  if (bVar3) {
    __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&weights,
               "Input weights should be specified in inputs rather than in options.",
               (allocator<char> *)&local_d0);
    JSONRPCError(__return_storage_ptr__,-8,(string *)&weights);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    if ((inputs->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (inputs->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_b0 = local_a0;
      local_a8 = 0;
      local_a0[0] = 0;
      str._M_string_length = (size_type)options;
      str._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
      str.field_2 = in_stack_fffffffffffffe58;
      UniValue::UniValue(&weights,VARR,str);
      std::__cxx11::string::~string((string *)&local_b0);
      pvVar4 = UniValue::getValues(inputs);
      pUVar2 = (pvVar4->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (this = (pvVar4->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                  super__Vector_impl_data._M_start; this != pUVar2; this = this + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"weight",(allocator<char> *)&stack0xfffffffffffffe5f);
        bVar3 = UniValue::exists(this,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        if (bVar3) {
          UniValue::UniValue(&local_128,this);
          val.val._M_dataplus._M_p = (pointer)options;
          val._0_8_ = in_stack_fffffffffffffe48;
          val.val._8_16_ = in_stack_fffffffffffffe58;
          val._32_56_ = in_stack_fffffffffffffe68;
          UniValue::push_back(&weights,val);
          UniValue::~UniValue(&local_128);
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffffeb8,"input_weights",(allocator<char> *)&local_d0);
      UniValue::UniValue((UniValue *)&stack0xfffffffffffffe60,&weights);
      key._M_string_length = (size_type)options;
      key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
      key.field_2 = in_stack_fffffffffffffe58;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffea0._0_8_;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffea0._8_24_;
      auVar5 = in_stack_fffffffffffffe68._8_32_;
      val_00.typ = in_stack_fffffffffffffe68._0_4_;
      val_00._4_4_ = in_stack_fffffffffffffe68._4_4_;
      val_00.val._M_dataplus._M_p = (pointer)auVar5._0_8_;
      val_00.val._M_string_length = auVar5._8_8_;
      val_00.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auVar5._16_16_;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe68._40_8_;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe68._48_8_;
      UniValue::pushKV(options,key,val_00);
      UniValue::~UniValue((UniValue *)&stack0xfffffffffffffe60);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
      UniValue::~UniValue(&weights);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void SetOptionsInputWeights(const UniValue& inputs, UniValue& options)
{
    if (options.exists("input_weights")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Input weights should be specified in inputs rather than in options.");
    }
    if (inputs.size() == 0) {
        return;
    }
    UniValue weights(UniValue::VARR);
    for (const UniValue& input : inputs.getValues()) {
        if (input.exists("weight")) {
            weights.push_back(input);
        }
    }
    options.pushKV("input_weights", std::move(weights));
}